

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Calendar::weekNumber
          (Calendar *this,int32_t desiredDay,int32_t dayOfPeriod,int32_t dayOfWeek)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = dayOfWeek - (dayOfPeriod + this->fFirstDayOfWeek);
  iVar1 = (int)((ulong)((long)(iVar2 + 1) * -0x6db6db6d) >> 0x20) + iVar2 + 1;
  iVar1 = ((iVar1 >> 2) - (iVar1 >> 0x1f)) * -7;
  iVar3 = iVar2 + iVar1 + 1;
  iVar1 = iVar2 + 8 + iVar1;
  if (-1 < iVar3) {
    iVar1 = iVar3;
  }
  iVar2 = (int)((ulong)((long)(desiredDay + iVar1 + -1) * -0x6db6db6d) >> 0x20) + desiredDay + iVar1
          + -1;
  return (((iVar2 >> 2) - (iVar2 >> 0x1f)) + 1) -
         (uint)(7U - iVar1 < (uint)this->fMinimalDaysInFirstWeek);
}

Assistant:

int32_t Calendar::weekNumber(int32_t desiredDay, int32_t dayOfPeriod, int32_t dayOfWeek)
{
    // Determine the day of the week of the first day of the period
    // in question (either a year or a month).  Zero represents the
    // first day of the week on this calendar.
    int32_t periodStartDayOfWeek = (dayOfWeek - getFirstDayOfWeek() - dayOfPeriod + 1) % 7;
    if (periodStartDayOfWeek < 0) periodStartDayOfWeek += 7;

    // Compute the week number.  Initially, ignore the first week, which
    // may be fractional (or may not be).  We add periodStartDayOfWeek in
    // order to fill out the first week, if it is fractional.
    int32_t weekNo = (desiredDay + periodStartDayOfWeek - 1)/7;

    // If the first week is long enough, then count it.  If
    // the minimal days in the first week is one, or if the period start
    // is zero, we always increment weekNo.
    if ((7 - periodStartDayOfWeek) >= getMinimalDaysInFirstWeek()) ++weekNo;

    return weekNo;
}